

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

bool __thiscall PatternBlock::specializes(PatternBlock *this,PatternBlock *op2)

{
  int iVar1;
  int iVar2;
  uintm uVar3;
  uintm uVar4;
  uintm uVar5;
  int startbit;
  uint size;
  
  iVar2 = (op2->nonzerosize + op2->offset) * 8;
  iVar1 = 0;
  do {
    startbit = iVar1;
    size = iVar2 - startbit;
    if (size == 0 || iVar2 < startbit) break;
    if (0x1f < size) {
      size = 0x20;
    }
    uVar3 = getMask(this,startbit,size);
    uVar4 = getMask(op2,startbit,size);
    if ((uVar4 & ~uVar3) != 0) break;
    uVar3 = getValue(op2,startbit,size);
    uVar5 = getValue(this,startbit,size);
    iVar1 = size + startbit;
  } while (((uVar5 ^ uVar3) & uVar4) == 0);
  return iVar2 <= startbit;
}

Assistant:

bool PatternBlock::specializes(const PatternBlock *op2) const

{				// does every masked bit in -this- match the corresponding
				// masked bit in -op2-
  int4 length = 8*op2->getLength();
  int4 tmplength;
  uintm mask1,mask2,value1,value2;
  int4 sbit = 0;
  while(sbit < length) {
    tmplength = length-sbit;
    if (tmplength > 8*sizeof(uintm))
      tmplength = 8*sizeof(uintm);
    mask1 = getMask(sbit,tmplength);
    value1 = getValue(sbit,tmplength);
    mask2 = op2->getMask(sbit,tmplength);
    value2 = op2->getValue(sbit,tmplength);
    if ((mask1 & mask2) != mask2) return false;
    if ((value1 & mask2) != (value2 & mask2)) return false;
    sbit += tmplength;
  }
  return true;
}